

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

HashType __thiscall
cfd::core::DescriptorScriptReference::GetHashType(DescriptorScriptReference *this)

{
  bool bVar1;
  CfdException *this_00;
  allocator local_51;
  string local_50;
  CfdSourceLocation local_30;
  DescriptorScriptReference *local_18;
  DescriptorScriptReference *this_local;
  
  local_18 = this;
  bVar1 = Script::IsP2shScript(&this->locking_script_);
  if (bVar1) {
    this_local._4_4_ = kP2sh;
  }
  else {
    bVar1 = Script::IsP2wpkhScript(&this->locking_script_);
    if (bVar1) {
      this_local._4_4_ = kP2wpkh;
    }
    else {
      bVar1 = Script::IsP2wshScript(&this->locking_script_);
      if (bVar1) {
        this_local._4_4_ = kP2wsh;
      }
      else {
        bVar1 = Script::IsTaprootScript(&this->locking_script_);
        if (bVar1) {
          this_local._4_4_ = kTaproot;
        }
        else {
          bVar1 = Script::IsP2pkScript(&this->locking_script_);
          if (!bVar1) {
            local_30.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                         ,0x2f);
            local_30.filename = local_30.filename + 1;
            local_30.line = 0x2f1;
            local_30.funcname = "GetHashType";
            logger::warn<>(&local_30,"Failed to GetHashType. unsupported hash type.");
            this_00 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_50,"unsupported hash type.",&local_51);
            CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_50);
            __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
          }
          this_local._4_4_ = kP2pkh;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

HashType DescriptorScriptReference::GetHashType() const {
  if (locking_script_.IsP2shScript()) {
    return HashType::kP2sh;
  }
  if (locking_script_.IsP2wpkhScript()) {
    return HashType::kP2wpkh;
  }
  if (locking_script_.IsP2wshScript()) {
    return HashType::kP2wsh;
  }
  if (locking_script_.IsTaprootScript()) {
    return HashType::kTaproot;
  }
  if (locking_script_.IsP2pkScript()) {
    return HashType::kP2pkh;
  }
  warn(CFD_LOG_SOURCE, "Failed to GetHashType. unsupported hash type.");
  throw CfdException(
      CfdError::kCfdIllegalArgumentError, "unsupported hash type.");
}